

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

int __thiscall
QTreeWidgetItem::clone
          (QTreeWidgetItem *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTreeWidgetItem *pQVar4;
  QTreeWidgetItem *other;
  long in_FS_OFFSET;
  int i;
  QTreeWidgetItem *parent;
  QTreeWidgetItem *item;
  QTreeWidgetItem *root;
  QStack<QTreeWidgetItem_*> parentStack;
  QStack<const_QTreeWidgetItem_*> stack;
  QTreeWidgetItem *copy;
  QTreeWidgetItem **in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QTreeWidgetItem *local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStack<const_QTreeWidgetItem_*>::QStack((QStack<const_QTreeWidgetItem_*> *)0x913df1);
  QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x913e1f);
  QStack<const_QTreeWidgetItem_*>::push
            ((QStack<const_QTreeWidgetItem_*> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  QStack<QTreeWidgetItem_*>::push
            ((QStack<QTreeWidgetItem_*> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  local_68 = (QTreeWidgetItem *)0x0;
  while (bVar2 = QList<const_QTreeWidgetItem_*>::isEmpty((QList<const_QTreeWidgetItem_*> *)0x913e7b)
        , ((bVar2 ^ 0xffU) & 1) != 0) {
    QStack<const_QTreeWidgetItem_*>::pop((QStack<const_QTreeWidgetItem_*> *)0x913e93);
    pQVar4 = QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x913ea2);
    other = (QTreeWidgetItem *)operator_new(0x60);
    QTreeWidgetItem(this,other);
    if (local_68 == (QTreeWidgetItem *)0x0) {
      local_68 = other;
    }
    if (pQVar4 != (QTreeWidgetItem *)0x0) {
      other->par = pQVar4;
      QList<QTreeWidgetItem_*>::insert
                ((QList<QTreeWidgetItem_*> *)other,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (parameter_type)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    in_stack_ffffffffffffff64 = 0;
    while (in_stack_ffffffffffffff7c = in_stack_ffffffffffffff64,
          iVar3 = childCount((QTreeWidgetItem *)0x913f37), in_stack_ffffffffffffff64 < iVar3) {
      child(other,in_stack_ffffffffffffff64);
      QStack<const_QTreeWidgetItem_*>::push
                ((QStack<const_QTreeWidgetItem_*> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      QStack<QTreeWidgetItem_*>::push
                ((QStack<QTreeWidgetItem_*> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff64 = in_stack_ffffffffffffff7c + 1;
    }
  }
  QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x913f9d);
  iVar3 = (int)local_68;
  QStack<const_QTreeWidgetItem_*>::~QStack((QStack<const_QTreeWidgetItem_*> *)0x913faa);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::clone() const
{
    QTreeWidgetItem *copy = nullptr;

    QStack<const QTreeWidgetItem*> stack;
    QStack<QTreeWidgetItem*> parentStack;
    stack.push(this);
    parentStack.push(0);

    QTreeWidgetItem *root = nullptr;
    const QTreeWidgetItem *item = nullptr;
    QTreeWidgetItem *parent = nullptr;
    while (!stack.isEmpty()) {
        // get current item, and copied parent
        item = stack.pop();
        parent = parentStack.pop();

        // copy item
        copy = new QTreeWidgetItem(*item);
        if (!root)
            root = copy;

        // set parent and add to parents children list
        if (parent) {
            copy->par = parent;
            parent->children.insert(0, copy);
        }

        for (int i = 0; i < item->childCount(); ++i) {
            stack.push(item->child(i));
            parentStack.push(copy);
        }
    }
    return root;
}